

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zetDeviceGetConcurrentMetricGroupsExp
          (zet_device_handle_t hDevice,uint32_t metricGroupCount,
          zet_metric_group_handle_t *phMetricGroups,uint32_t *pMetricGroupsCountPerConcurrentGroup,
          uint32_t *pConcurrentGroupCount)

{
  zet_pfnDeviceGetConcurrentMetricGroupsExp_t pfnGetConcurrentMetricGroupsExp;
  ze_result_t result;
  uint32_t *pConcurrentGroupCount_local;
  uint32_t *pMetricGroupsCountPerConcurrentGroup_local;
  zet_metric_group_handle_t *phMetricGroups_local;
  uint32_t metricGroupCount_local;
  zet_device_handle_t hDevice_local;
  
  pfnGetConcurrentMetricGroupsExp._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c800 != (code *)0x0) {
    pfnGetConcurrentMetricGroupsExp._4_4_ =
         (*DAT_0011c800)(hDevice,metricGroupCount,phMetricGroups,
                         pMetricGroupsCountPerConcurrentGroup,pConcurrentGroupCount);
  }
  return pfnGetConcurrentMetricGroupsExp._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetDeviceGetConcurrentMetricGroupsExp(
        zet_device_handle_t hDevice,                    ///< [in] handle of the device
        uint32_t metricGroupCount,                      ///< [in] metric group count
        zet_metric_group_handle_t * phMetricGroups,     ///< [in,out] metrics groups to be re-arranged to be sets of concurrent
                                                        ///< groups
        uint32_t * pMetricGroupsCountPerConcurrentGroup,///< [in,out][optional][*pConcurrentGroupCount] count of metric groups per
                                                        ///< concurrent group.
        uint32_t * pConcurrentGroupCount                ///< [out] number of concurrent groups.
                                                        ///< The value of this parameter could be used to determine the number of
                                                        ///< replays necessary.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetConcurrentMetricGroupsExp = context.zetDdiTable.DeviceExp.pfnGetConcurrentMetricGroupsExp;
        if( nullptr != pfnGetConcurrentMetricGroupsExp )
        {
            result = pfnGetConcurrentMetricGroupsExp( hDevice, metricGroupCount, phMetricGroups, pMetricGroupsCountPerConcurrentGroup, pConcurrentGroupCount );
        }
        else
        {
            // generic implementation
        }

        return result;
    }